

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O1

void __thiscall
kratos::Property::edge(Property *this,EventEdgeType type,shared_ptr<kratos::Var> *var)

{
  int iVar1;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  undefined1 local_50 [39];
  allocator_type local_29;
  
  iVar1 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  if (iVar1 == 1) {
    EventControl::EventControl
              ((EventControl *)local_50,type,
               (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    *(ulong *)((long)&(this->edge_).var + 4) = CONCAT44(local_50._16_4_,local_50._12_4_);
    (this->edge_).edge = local_50._20_4_;
    (this->edge_).delay_side = local_50._24_4_;
    (this->edge_).delay = local_50._0_8_;
    (this->edge_).var = (Var *)CONCAT44(local_50._12_4_,local_50._8_4_);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"{0} should be width 1","");
  local_70 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_68,__l,&local_29);
  VarException::VarException(this_00,(string *)local_50,&local_68);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Property::edge(kratos::EventEdgeType type, const std::shared_ptr<Var> &var) {
    if (var->width() != 1) throw VarException("{0} should be width 1", {var.get()});
    edge_ = EventControl(type, *var);
}